

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O2

Queue * make_define_argument_list(size_t number_of_arguments)

{
  Queue *pQVar1;
  Queue *q;
  bool bVar2;
  
  if (number_of_arguments == 0) {
    pQVar1 = (Queue *)0x0;
  }
  else {
    pQVar1 = (Queue *)malloc(number_of_arguments * 0x18);
    q = pQVar1;
    while (bVar2 = number_of_arguments != 0, number_of_arguments = number_of_arguments - 1, bVar2) {
      Queue_Init(q);
      q = q + 1;
    }
  }
  return pQVar1;
}

Assistant:

struct Queue* make_define_argument_list(size_t number_of_arguments)
{
	size_t i;
	struct Queue *ret;

	if(number_of_arguments==0)
		return NULL;

	ret=malloc(sizeof(struct Queue)*number_of_arguments);

	for(i=0;i<number_of_arguments;++i)
	{
		Queue_Init(ret+i);
	}
	return ret;
}